

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

void __thiscall State::AddPool(State *this,Pool *pool)

{
  Pool *pPVar1;
  mapped_type *ppPVar2;
  
  pPVar1 = LookupPool(this,&pool->name_);
  if (pPVar1 == (Pool *)0x0) {
    ppPVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
              ::operator[](&this->pools_,&pool->name_);
    *ppPVar2 = pool;
    return;
  }
  __assert_fail("LookupPool(pool->name()) == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/state.cc",
                0x4b,"void State::AddPool(Pool *)");
}

Assistant:

void State::AddPool(Pool* pool) {
  assert(LookupPool(pool->name()) == NULL);
  pools_[pool->name()] = pool;
}